

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O1

void find_path(PATHFIND_DATA *path,ROOM_INDEX_DATA *goal)

{
  EXIT_DATA *pEVar1;
  ROOM_INDEX_DATA *pRVar2;
  PATHFIND_DATA *pPVar3;
  int i;
  long lVar4;
  bool bVar5;
  int i_1;
  
  path->evaluated = true;
  iterations = iterations + 1;
  if (path->room == goal) {
    if ((best_path == (PATHFIND_DATA *)0x0) || (path->steps < best_path->steps)) {
      best_path = path;
    }
  }
  else {
    lVar4 = 0;
    bVar5 = false;
    do {
      if (((best_path != (PATHFIND_DATA *)0x0) && (best_path->steps < 2)) ||
         (((pEVar1 = path->room->exit[lVar4], pEVar1 != (EXIT_DATA *)0x0 &&
           ((pRVar2 = (pEVar1->u1).to_room, pRVar2 != (ROOM_INDEX_DATA *)0x0 &&
            (pRVar2->area == goal->area)))) &&
          ((pPVar3 = pRVar2->path, pPVar3 == (PATHFIND_DATA *)0x0 ||
           (((path->steps + 1 < pPVar3->steps || (pPVar3->evaluated == false)) &&
            ((pPVar3 == (PATHFIND_DATA *)0x0 ||
             ((path->steps < pPVar3->steps || (pPVar3->evaluated == true)))))))))))) {
        bVar5 = true;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    if (bVar5) {
      lVar4 = 0;
      do {
        pEVar1 = path->room->exit[lVar4];
        if ((((pEVar1 != (EXIT_DATA *)0x0) &&
             (pRVar2 = (pEVar1->u1).to_room, pRVar2 != (ROOM_INDEX_DATA *)0x0)) &&
            (pRVar2->area == goal->area)) &&
           ((pPVar3 = pRVar2->path, pPVar3 == (PATHFIND_DATA *)0x0 ||
            (((path->steps + 1 < pPVar3->steps || (pPVar3->evaluated == false)) &&
             ((pPVar3 == (PATHFIND_DATA *)0x0 ||
              ((path->steps < pPVar3->steps || (pPVar3->evaluated == true)))))))))) {
          pPVar3 = new_path_data();
          pPVar3->room = (ROOM_INDEX_DATA *)path->room->exit[lVar4]->u1;
          pPVar3->dir_from = (int)lVar4;
          pPVar3->steps = path->steps + 1;
          pPVar3->prev = path;
          path->dir_to[lVar4] = pPVar3;
          ((path->room->exit[lVar4]->u1).to_room)->path = pPVar3;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 6);
      lVar4 = 7;
      do {
        pEVar1 = path->room->exit[lVar4 + -7];
        if ((((pEVar1 != (EXIT_DATA *)0x0) && (path->dir_to[lVar4 + -7] != (PATHFIND_DATA *)0x0)) &&
            (pRVar2 = (pEVar1->u1).to_room, pRVar2 != (ROOM_INDEX_DATA *)0x0)) &&
           ((pRVar2->area == goal->area && (pRVar2->path->evaluated == false)))) {
          find_path(path->dir_to[lVar4 + -7],goal);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0xd);
    }
    else {
      path->dir_to[4] = (PATHFIND_DATA *)0x0;
      path->dir_to[5] = (PATHFIND_DATA *)0x0;
      path->dir_to[2] = (PATHFIND_DATA *)0x0;
      path->dir_to[3] = (PATHFIND_DATA *)0x0;
      path->dir_to[0] = (PATHFIND_DATA *)0x0;
      path->dir_to[1] = (PATHFIND_DATA *)0x0;
    }
  }
  return;
}

Assistant:

void find_path(PATHFIND_DATA *path, ROOM_INDEX_DATA *goal)
{
	path->evaluated = true;
	iterations++;

	if (path->room == goal)
	{
		if (!best_path || best_path->steps > path->steps)
			best_path = path;

		return;
	}

	auto found = false;
	for (auto i = 0; i < 6; i++)
	{
		if ((best_path && best_path->steps < 2)
			|| (path->room->exit[i] 
				&& path->room->exit[i]->u1.to_room
				&& path->room->exit[i]->u1.to_room->area == goal->area
				&& !(path->room->exit[i]->u1.to_room->path
					&& path->room->exit[i]->u1.to_room->path->steps <= path->steps + 1
					&& path->room->exit[i]->u1.to_room->path->evaluated)
				&& !(path->room->exit[i]->u1.to_room->path
					&& path->room->exit[i]->u1.to_room->path->steps < path->steps + 1
					&& !path->room->exit[i]->u1.to_room->path->evaluated)))
		{
			found = true;
		}
	}

	if (!found)
	{
		for (auto i = 0; i < 6; i++)
		{
			path->dir_to[i] = nullptr;
		}

		return;
	}

	for (auto i = 0; i < 6; i++)
	{
		if (!path->room->exit[i]
			|| !path->room->exit[i]->u1.to_room
			|| path->room->exit[i]->u1.to_room->area != goal->area
			|| (path->room->exit[i]->u1.to_room->path 
				&& path->room->exit[i]->u1.to_room->path->steps <= path->steps + 1 
				&& path->room->exit[i]->u1.to_room->path->evaluated)
			|| (path->room->exit[i]->u1.to_room->path
				&& path->room->exit[i]->u1.to_room->path->steps < path->steps + 1
				&& !path->room->exit[i]->u1.to_room->path->evaluated))
		{
			continue;
		}

		auto next_path = new_path_data();
		next_path->room = path->room->exit[i]->u1.to_room;
		next_path->dir_from = i;
		next_path->steps = path->steps + 1;
		next_path->prev = path;

		path->dir_to[i] = next_path;
		path->room->exit[i]->u1.to_room->path = next_path;
	}

	for (auto i = 0; i < 6; i++)
	{
		if (!path->room->exit[i]
			|| !path->dir_to[i]
			|| !path->room->exit[i]->u1.to_room
			|| path->room->exit[i]->u1.to_room->area != goal->area
			|| path->room->exit[i]->u1.to_room->path->evaluated)
		{
			continue;
		}

		find_path(path->dir_to[i], goal);
	}
}